

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool tree_sitter_gdscript_external_scanner_scan(void *payload,TSLexer *lexer,_Bool *valid_symbols)

{
  ushort uVar1;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  bool bVar5;
  _Bool _Var6;
  TSSymbol TVar7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  byte unaff_BPL;
  size_t __size;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  byte bVar15;
  bool bVar16;
  byte local_4c;
  
  if (valid_symbols[4] == true) {
    bVar14 = valid_symbols[1];
  }
  else {
    bVar14 = 0;
  }
  bVar15 = 1;
  if ((valid_symbols[9] == false) && (valid_symbols[7] == false)) {
    bVar15 = valid_symbols[8];
  }
  local_4c = unaff_BPL;
  if (valid_symbols[4] != false) {
    iVar2 = **(int **)((long)payload + 8);
    if (iVar2 != 0 && (bVar14 & 1) == 0) {
      bVar11 = *(byte *)(*(long *)(*(int **)((long)payload + 8) + 2) + (ulong)(iVar2 - 1));
      uVar9 = 0x27;
      if (((bVar11 & 1) == 0) && (uVar9 = 0x22, (bVar11 & 2) == 0)) {
        uVar9 = (int)((uint)bVar11 << 0x1d) >> 0x1f & 0x60;
      }
      uVar13 = lexer->lookahead;
      bVar16 = uVar13 == 0;
      if (bVar16) {
LAB_001044af:
        local_4c = (byte)uVar13;
      }
      else {
        uVar10 = 0x22;
        if ((bVar11 & 2) == 0) {
          uVar10 = (int)((uint)bVar11 << 0x1d) >> 0x1f & 0x60;
        }
        uVar12 = 0x27;
        if ((bVar11 & 1) == 0) {
          uVar12 = uVar10;
        }
        local_4c = false;
        bVar5 = bVar16;
        do {
          while (uVar13 == 0x5c) {
LAB_001043f3:
            if ((bVar11 & 8) == 0) {
              if ((bVar11 & 0x40) == 0) {
                (*lexer->mark_end)(lexer);
              }
              else {
                (*lexer->mark_end)(lexer);
                (*lexer->advance)(lexer,false);
                uVar13 = lexer->lookahead - 0x4e;
                if ((uVar13 < 0x28) && ((0x8000000081U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) {
                  (*lexer->advance)(lexer,false);
                  goto LAB_00104486;
                }
              }
              lexer->result_symbol = 4;
              bVar16 = bVar5;
              goto LAB_001044c1;
            }
            (*lexer->advance)(lexer,false);
            if ((lexer->lookahead == 0x5c) || (lexer->lookahead == uVar12)) {
              (*lexer->advance)(lexer,false);
            }
            uVar13 = lexer->lookahead;
            bVar16 = uVar13 == 0;
            if (bVar16) goto LAB_001044c1;
          }
          if ((uVar13 == 0x7d) || (uVar13 == 0x7b)) {
            if ((bVar11 & 0x10) != 0) {
              (*lexer->mark_end)(lexer);
              lexer->result_symbol = 4;
              goto LAB_001044c1;
            }
            if (uVar13 == 0x5c) goto LAB_001043f3;
          }
          if (uVar13 == uVar9) {
            if ((bVar11 & 0x20) == 0) {
              TVar7 = 4;
              if (!(bool)local_4c) {
                (*lexer->advance)(lexer,false);
                **(int **)((long)payload + 8) = **(int **)((long)payload + 8) + -1;
                TVar7 = 5;
              }
              lexer->result_symbol = TVar7;
              (*lexer->mark_end)(lexer);
            }
            else {
              (*lexer->mark_end)(lexer);
              (*lexer->advance)(lexer,false);
              if ((lexer->lookahead == uVar9) &&
                 ((*lexer->advance)(lexer,false), lexer->lookahead == uVar9)) {
                if (!(bool)local_4c) {
                  (*lexer->advance)(lexer,false);
                  (*lexer->mark_end)(lexer);
                  **(int **)((long)payload + 8) = **(int **)((long)payload + 8) + -1;
                  lexer->result_symbol = 5;
                  goto LAB_00104966;
                }
              }
              else {
                (*lexer->mark_end)(lexer);
              }
              lexer->result_symbol = 4;
            }
LAB_00104966:
            uVar13 = 1;
            goto LAB_001044af;
          }
          if ((local_4c & (uVar13 == 10 && (bVar11 & 0x20) == 0)) != 0) break;
LAB_00104486:
          (*lexer->advance)(lexer,false);
          uVar13 = lexer->lookahead;
          local_4c = true;
          bVar16 = uVar13 == 0;
          bVar5 = bVar16;
        } while (!bVar16);
        local_4c = 0;
      }
LAB_001044c1:
      if (!bVar16) goto LAB_001048b2;
    }
  }
  (*lexer->mark_end)(lexer);
  uVar9 = 0xffffffff;
  bVar16 = false;
  uVar13 = 0;
  do {
    iVar2 = lexer->lookahead;
    if (iVar2 < 0x20) {
      if (iVar2 - 0xcU < 2) {
LAB_001044fd:
        uVar13 = 0;
      }
      else {
        if (iVar2 != 9) {
          if (iVar2 == 10) {
            bVar16 = true;
            goto LAB_001044fd;
          }
LAB_00104576:
          _Var6 = (*lexer->eof)(lexer);
          if (_Var6) {
            uVar13 = 0;
          }
          if (bVar16 || _Var6) {
            puVar3 = *payload;
            uVar10 = *puVar3;
            if (uVar10 != 0) {
              uVar1 = *(ushort *)((long)*(void **)(puVar3 + 2) + (ulong)(uVar10 - 1) * 2);
              if ((valid_symbols[1] == true) && (uVar1 < uVar13)) {
                if (puVar3[1] == uVar10) {
                  __size = 0x20;
                  if (0xf < uVar10 * 2) {
                    __size = (ulong)(uVar10 * 2) * 2;
                  }
                  pvVar8 = realloc(*(void **)(puVar3 + 2),__size);
                  if (pvVar8 == (void *)0x0) {
                    __assert_fail("tmp != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                                  ,0x13b,
                                  "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                                 );
                  }
                  piVar4 = *payload;
                  *(void **)(piVar4 + 2) = pvVar8;
                  uVar10 = 0x10;
                  if (0x10 < (uint)(*piVar4 * 2)) {
                    uVar10 = *piVar4 * 2;
                  }
                  piVar4[1] = uVar10;
                }
                puVar3 = *payload;
                uVar10 = *puVar3;
                *puVar3 = uVar10 + 1;
                *(short *)(*(long *)(puVar3 + 2) + (ulong)uVar10 * 2) = (short)uVar13;
                TVar7 = 1;
LAB_00104644:
                lexer->result_symbol = TVar7;
                local_4c = 1;
                bVar16 = false;
              }
              else if (((valid_symbols[2] != false) ||
                       ((bVar16 = true, *valid_symbols == false &&
                        (((bVar15 | valid_symbols[3]) & 1) == 0)))) &&
                      (bVar16 = true, (int)uVar9 < (int)(uint)uVar1 && uVar13 < uVar1)) {
                *puVar3 = uVar10 - 1;
                TVar7 = 2;
                goto LAB_00104644;
              }
              if (!bVar16) goto LAB_001048b2;
            }
            if (((~*valid_symbols | bVar14) & 1) != 0) goto LAB_00104666;
            lexer->result_symbol = 0;
LAB_0010470e:
            local_4c = 1;
            goto LAB_001048b2;
          }
LAB_00104666:
          if (((((valid_symbols[10] == false) && (valid_symbols[7] == false)) &&
               (valid_symbols[9] == false)) && (valid_symbols[8] == false)) &&
             ((bVar14 != 0 || (valid_symbols[0xb] == true)))) {
            uVar13 = lexer->lookahead - 0x29;
            if (((uVar13 < 0x35) && ((0x10000000000009U >> ((ulong)uVar13 & 0x3f) & 1) != 0)) ||
               (lexer->lookahead == 0x7d)) {
              if (valid_symbols[2] == true) {
                iVar2 = **payload;
                if (iVar2 != 0) {
                  **payload = iVar2 + -1;
                }
              }
              lexer->result_symbol = 0xb;
              goto LAB_0010470e;
            }
          }
          if ((uVar9 == 0xffffffff) && (valid_symbols[3] == true)) {
            bVar14 = 1;
            bVar15 = 0;
            break;
          }
          goto LAB_001048b0;
        }
        uVar13 = uVar13 + 8;
      }
    }
    else if (iVar2 == 0x5c) {
      (*lexer->advance)(lexer,true);
      if (lexer->lookahead == 0xd) {
        (*lexer->advance)(lexer,true);
      }
      if ((lexer->lookahead != 10) && (_Var6 = (*lexer->eof)(lexer), !_Var6)) goto LAB_001048b0;
    }
    else {
      if (iVar2 == 0x23) {
        if (uVar9 == 0xffffffff) {
          uVar9 = uVar13;
        }
        while ((lexer->lookahead != 0 && (lexer->lookahead != 10))) {
          (*lexer->advance)(lexer,true);
        }
        goto LAB_001044fd;
      }
      if (iVar2 != 0x20) goto LAB_00104576;
      uVar13 = uVar13 + 1;
    }
    (*lexer->advance)(lexer,true);
  } while( true );
LAB_001046a1:
  iVar2 = lexer->lookahead;
  bVar11 = bVar15;
  if (iVar2 < 0x60) {
    if (iVar2 < 0x46) {
      if (iVar2 != 0x42) {
        if (iVar2 == 0x22) {
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar11 = bVar15 | 2;
          if ((lexer->lookahead == 0x22) &&
             ((*lexer->advance)(lexer,false), lexer->lookahead == 0x22)) {
            (*lexer->advance)(lexer,false);
            (*lexer->mark_end)(lexer);
            bVar11 = bVar15 | 0x22;
          }
        }
        else if (iVar2 == 0x27) {
          (*lexer->advance)(lexer,false);
          (*lexer->mark_end)(lexer);
          bVar11 = bVar15 | 1;
          if ((lexer->lookahead == 0x27) &&
             ((*lexer->advance)(lexer,false), lexer->lookahead == 0x27)) {
            (*lexer->advance)(lexer,false);
            (*lexer->mark_end)(lexer);
            bVar11 = bVar15 | 0x21;
          }
        }
LAB_0010483c:
        if ((bVar11 & 7) == 0) {
          local_4c = local_4c & bVar14;
        }
        else {
          piVar4 = *(int **)((long)payload + 8);
          if (piVar4[1] == *piVar4) {
            uVar9 = *piVar4 * 2;
            if (uVar9 < 0x11) {
              uVar9 = 0x10;
            }
            pvVar8 = realloc(*(void **)(piVar4 + 2),(ulong)uVar9);
            if (pvVar8 == (void *)0x0) {
              __assert_fail("tmp != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/PrestonKnopp[P]tree-sitter-gdscript/src/scanner.c"
                            ,0x1a5,
                            "_Bool tree_sitter_gdscript_external_scanner_scan(void *, TSLexer *, const _Bool *)"
                           );
            }
            piVar4 = *(int **)((long)payload + 8);
            *(void **)(piVar4 + 2) = pvVar8;
            uVar9 = 0x10;
            if (0x10 < (uint)(*piVar4 * 2)) {
              uVar9 = *piVar4 * 2;
            }
            piVar4[1] = uVar9;
          }
          puVar3 = *(uint **)((long)payload + 8);
          uVar9 = *puVar3;
          *puVar3 = uVar9 + 1;
          *(byte *)(*(long *)(puVar3 + 2) + (ulong)uVar9) = bVar11;
          lexer->result_symbol = 3;
          local_4c = 1;
          bVar14 = 0;
        }
        if (bVar14 != 0) {
LAB_001048b0:
          local_4c = 0;
        }
LAB_001048b2:
        return (_Bool)(local_4c & 1);
      }
LAB_001046c8:
      bVar15 = bVar15 | 0x40;
    }
    else if (iVar2 == 0x46) {
LAB_001046f7:
      bVar15 = bVar15 | 0x10;
    }
    else {
      if (iVar2 == 0x52) goto LAB_001046f1;
      if (iVar2 != 0x55) goto LAB_0010483c;
    }
  }
  else {
    if (iVar2 < 0x72) {
      if (iVar2 == 0x62) goto LAB_001046c8;
      if (iVar2 == 0x66) goto LAB_001046f7;
      if (iVar2 == 0x60) {
        (*lexer->advance)(lexer,false);
        (*lexer->mark_end)(lexer);
        bVar11 = bVar15 | 4;
      }
      goto LAB_0010483c;
    }
    if (iVar2 == 0x72) {
LAB_001046f1:
      bVar15 = bVar15 | 8;
    }
    else if (iVar2 != 0x75) goto LAB_0010483c;
  }
  bVar14 = 0;
  (*lexer->advance)(lexer,false);
  goto LAB_001046a1;
}

Assistant:

bool tree_sitter_gdscript_external_scanner_scan(void *payload, TSLexer *lexer,
                                                const bool *valid_symbols) {
    Scanner *scanner = (Scanner *)payload;

    bool error_recovery_mode =
        valid_symbols[STRING_CONTENT] && valid_symbols[INDENT];
    bool within_brackets = valid_symbols[CLOSE_BRACE] ||
                           valid_symbols[CLOSE_PAREN] ||
                           valid_symbols[CLOSE_BRACKET];

    if (valid_symbols[STRING_CONTENT] && scanner->delimiters->len > 0 &&
        !error_recovery_mode) {
        Delimiter delimiter = VEC_BACK(scanner->delimiters);
        int32_t end_char = end_character(&delimiter);
        bool has_content = false;
        while (lexer->lookahead) {
            if ((lexer->lookahead == '{' || lexer->lookahead == '}') &&
                is_format(&delimiter)) {
                lexer->mark_end(lexer);
                lexer->result_symbol = STRING_CONTENT;
                return has_content;
            }
            if (lexer->lookahead == '\\') {
                if (is_raw(&delimiter)) {
                    // Step over the backslash.
                    lexer->advance(lexer, false);
                    // Step over any escaped quotes.
                    if (lexer->lookahead == end_character(&delimiter) ||
                        lexer->lookahead == '\\') {
                        lexer->advance(lexer, false);
                    }
                    continue;
                }
                if (is_bytes(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == 'N' || lexer->lookahead == 'u' ||
                        lexer->lookahead == 'U') {
                        // In bytes string, \N{...}, \uXXXX and \UXXXXXXXX are
                        // not escape sequences
                        // https://docs.python.org/3/reference/lexical_analysis.html#string-and-bytes-literals
                        lexer->advance(lexer, false);
                    } else {
                        lexer->result_symbol = STRING_CONTENT;
                        return has_content;
                    }
                } else {
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return has_content;
                }
            } else if (lexer->lookahead == end_char) {
                if (is_triple(&delimiter)) {
                    lexer->mark_end(lexer);
                    lexer->advance(lexer, false);
                    if (lexer->lookahead == end_char) {
                        lexer->advance(lexer, false);
                        if (lexer->lookahead == end_char) {
                            if (has_content) {
                                lexer->result_symbol = STRING_CONTENT;
                            } else {
                                lexer->advance(lexer, false);
                                lexer->mark_end(lexer);
                                VEC_POP(scanner->delimiters);
                                lexer->result_symbol = STRING_END;
                            }
                            return true;
                        }
                        lexer->mark_end(lexer);
                        lexer->result_symbol = STRING_CONTENT;
                        return true;
                    }
                    lexer->mark_end(lexer);
                    lexer->result_symbol = STRING_CONTENT;
                    return true;
                }
                if (has_content) {
                    lexer->result_symbol = STRING_CONTENT;
                } else {
                    lexer->advance(lexer, false);
                    VEC_POP(scanner->delimiters);
                    lexer->result_symbol = STRING_END;
                }
                lexer->mark_end(lexer);
                return true;

            } else if (lexer->lookahead == '\n' && has_content &&
                       !is_triple(&delimiter)) {
                return false;
            }
            advance(lexer);
            has_content = true;
        }
    }

    lexer->mark_end(lexer);

    bool found_end_of_line = false;
    uint32_t indent_length = 0;
    int32_t first_comment_indent_length = -1;
    for (;;) {
        if (lexer->lookahead == '\n') {
            found_end_of_line = true;
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == ' ') {
            indent_length++;
            skip(lexer);
        } else if (lexer->lookahead == '\r' || lexer->lookahead == '\f') {
            indent_length = 0;
            skip(lexer);
        } else if (lexer->lookahead == '\t') {
            indent_length += 8;
            skip(lexer);
        } else if (lexer->lookahead == '#') {
            if (first_comment_indent_length == -1) {
                first_comment_indent_length = (int32_t)indent_length;
            }
            while (lexer->lookahead && lexer->lookahead != '\n') {
                skip(lexer);
            }
            skip(lexer);
            indent_length = 0;
        } else if (lexer->lookahead == '\\') {
            skip(lexer);
            if (lexer->lookahead == '\r') {
                skip(lexer);
            }
            if (lexer->lookahead == '\n' || lexer->eof(lexer)) {
                skip(lexer);
            } else {
                return false;
            }
        } else if (lexer->eof(lexer)) {
            indent_length = 0;
            found_end_of_line = true;
            break;
        } else {
            break;
        }
    }

    if (found_end_of_line) {
        if (scanner->indents->len > 0) {
            uint16_t current_indent_length = VEC_BACK(scanner->indents);

            if (valid_symbols[INDENT] &&
                indent_length > current_indent_length) {
                VEC_PUSH(scanner->indents, indent_length);
                lexer->result_symbol = INDENT;
                return true;
            }

            if ((valid_symbols[DEDENT] ||
                 (!valid_symbols[NEWLINE] && !valid_symbols[STRING_START] &&
                  !within_brackets)) &&
                indent_length < current_indent_length &&

                // Wait to create a dedent token until we've consumed any
                // comments
                // whose indentation matches the current block.
                first_comment_indent_length < (int32_t)current_indent_length) {
                VEC_POP(scanner->indents);
                lexer->result_symbol = DEDENT;
                return true;
            }
        }

        if (valid_symbols[NEWLINE] && !error_recovery_mode) {
            lexer->result_symbol = NEWLINE;
            return true;
        }
    }

    // This if statement can be placed before the above if statement that
    // handles newlines. However, it feels safer to give indentation and
    // newlines higher precedence.
    if (
        // Guard against BODY_END tokens overriding valid tokens.
        !valid_symbols[COMMA] &&
        /* !valid_symbols[COLON] && */
        !valid_symbols[CLOSE_PAREN] && !valid_symbols[CLOSE_BRACE] &&
        !valid_symbols[CLOSE_BRACKET] &&

        // Body ends occur in error recovery mode since the grammar does not
        // (cannot?) specify that a body can end with the below characters
        // without consuming them itself.
        (error_recovery_mode || valid_symbols[BODY_END])) {
        if (lexer->lookahead == ',' || // separator
            lexer->lookahead == ')' || // args, params, paren expr
            lexer->lookahead == '}' || // dictionary (may not be needed)
            lexer->lookahead == ']'    // array
            /* lexer->lookahead == ':'     // key-value pairs (breaks if
               elses) */
        ) {
            // BODY_END tokens can take the place of a dedent. Therefore, we
            // should pop the stack when DEDENT is valid.
            if (valid_symbols[DEDENT] && scanner->indents->len > 0) {
                VEC_POP(scanner->indents);
            }
            lexer->result_symbol = BODY_END;
            return true;
        }
    }

    if (first_comment_indent_length == -1 && valid_symbols[STRING_START]) {
        Delimiter delimiter = new_delimiter();

        bool has_flags = false;
        while (lexer->lookahead) {
            if (lexer->lookahead == 'f' || lexer->lookahead == 'F') {
                set_format(&delimiter);
            } else if (lexer->lookahead == 'r' || lexer->lookahead == 'R') {
                set_raw(&delimiter);
            } else if (lexer->lookahead == 'b' || lexer->lookahead == 'B') {
                set_bytes(&delimiter);
            } else if (lexer->lookahead != 'u' && lexer->lookahead != 'U') {
                break;
            }
            has_flags = true;
            advance(lexer);
        }

        if (lexer->lookahead == '`') {
            set_end_character(&delimiter, '`');
            advance(lexer);
            lexer->mark_end(lexer);
        } else if (lexer->lookahead == '\'') {
            set_end_character(&delimiter, '\'');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '\'') {
                advance(lexer);
                if (lexer->lookahead == '\'') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        } else if (lexer->lookahead == '"') {
            set_end_character(&delimiter, '"');
            advance(lexer);
            lexer->mark_end(lexer);
            if (lexer->lookahead == '"') {
                advance(lexer);
                if (lexer->lookahead == '"') {
                    advance(lexer);
                    lexer->mark_end(lexer);
                    set_triple(&delimiter);
                }
            }
        }

        if (end_character(&delimiter)) {
            VEC_PUSH(scanner->delimiters, delimiter);
            lexer->result_symbol = STRING_START;

            return true;
        }
        if (has_flags) {
            return false;
        }
    }

    return false;
}